

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3RollbackAll(sqlite3 *db,int tripCode)

{
  Btree *p;
  bool bVar1;
  long lVar2;
  long lVar3;
  
  if (sqlite3Hooks_0 != (code *)0x0) {
    (*sqlite3Hooks_0)();
  }
  sqlite3BtreeEnterAll(db);
  lVar3 = 0;
  bVar1 = false;
  for (lVar2 = 0; lVar2 < db->nDb; lVar2 = lVar2 + 1) {
    p = *(Btree **)((long)&db->aDb->pBt + lVar3);
    if (p != (Btree *)0x0) {
      if (p->inTrans == '\x02') {
        bVar1 = true;
      }
      sqlite3BtreeRollback(p,tripCode);
      (&db->aDb->inTrans)[lVar3] = '\0';
    }
    lVar3 = lVar3 + 0x20;
  }
  sqlite3VtabRollback(db);
  if (sqlite3Hooks_1 != (code *)0x0) {
    (*sqlite3Hooks_1)();
  }
  if (((db->flags & 2) != 0) && ((db->init).busy == '\0')) {
    sqlite3ExpirePreparedStatements(db);
    sqlite3ResetAllSchemasOfConnection(db);
  }
  sqlite3BtreeLeaveAll(db);
  db->nDeferredCons = 0;
  if ((db->xRollbackCallback != (_func_void_void_ptr *)0x0) && ((bVar1 || (db->autoCommit == '\0')))
     ) {
    (*db->xRollbackCallback)(db->pRollbackArg);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RollbackAll(sqlite3 *db, int tripCode){
  int i;
  int inTrans = 0;
  assert( sqlite3_mutex_held(db->mutex) );
  sqlite3BeginBenignMalloc();

  /* Obtain all b-tree mutexes before making any calls to BtreeRollback(). 
  ** This is important in case the transaction being rolled back has
  ** modified the database schema. If the b-tree mutexes are not taken
  ** here, then another shared-cache connection might sneak in between
  ** the database rollback and schema reset, which can cause false
  ** corruption reports in some cases.  */
  sqlite3BtreeEnterAll(db);

  for(i=0; i<db->nDb; i++){
    Btree *p = db->aDb[i].pBt;
    if( p ){
      if( sqlite3BtreeIsInTrans(p) ){
        inTrans = 1;
      }
      sqlite3BtreeRollback(p, tripCode);
      db->aDb[i].inTrans = 0;
    }
  }
  sqlite3VtabRollback(db);
  sqlite3EndBenignMalloc();

  if( (db->flags&SQLITE_InternChanges)!=0 && db->init.busy==0 ){
    sqlite3ExpirePreparedStatements(db);
    sqlite3ResetAllSchemasOfConnection(db);
  }
  sqlite3BtreeLeaveAll(db);

  /* Any deferred constraint violations have now been resolved. */
  db->nDeferredCons = 0;

  /* If one has been configured, invoke the rollback-hook callback */
  if( db->xRollbackCallback && (inTrans || !db->autoCommit) ){
    db->xRollbackCallback(db->pRollbackArg);
  }
}